

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_238a35::SndioPlayback::reset(SndioPlayback *this)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  ALCchar *pAVar3;
  byte *__value;
  char *pcVar4;
  long in_RDI;
  sio_par par;
  vector<al::byte,_al::allocator<al::byte,_1UL>_> *in_stack_ffffffffffffff38;
  byte *in_stack_ffffffffffffff40;
  __normal_iterator<al::byte_*,_std::vector<al::byte,_al::allocator<al::byte,_1UL>_>_>
  in_stack_ffffffffffffff48;
  __normal_iterator<al::byte_*,_std::vector<al::byte,_al::allocator<al::byte,_1UL>_>_>
  in_stack_ffffffffffffff50;
  FILE *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  uint local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint local_38;
  undefined4 local_34;
  int local_30;
  int local_28;
  int local_24;
  bool local_1;
  
  sio_initpar(&local_50);
  local_34 = *(undefined4 *)(*(long *)(in_RDI + 8) + 0xc);
  switch(*(undefined1 *)(*(long *)(in_RDI + 8) + 0x18)) {
  case 0:
    local_38 = 1;
    break;
  case 1:
  case 6:
    local_38 = 2;
    break;
  case 2:
    local_38 = 4;
    break;
  case 3:
  case 7:
    local_38 = 6;
    break;
  case 4:
    local_38 = 7;
    break;
  case 5:
    local_38 = 8;
  }
  switch(*(undefined1 *)(*(long *)(in_RDI + 8) + 0x19)) {
  case 0:
    local_50 = 8;
    local_48 = 1;
    break;
  case 1:
    local_50 = 8;
    local_48 = 0;
    break;
  case 2:
  case 6:
    local_50 = 0x10;
    local_48 = 1;
    break;
  case 3:
    local_50 = 0x10;
    local_48 = 0;
    break;
  case 4:
    local_50 = 0x20;
    local_48 = 1;
    break;
  case 5:
    local_50 = 0x20;
    local_48 = 0;
  }
  local_44 = 1;
  local_28 = *(int *)(*(long *)(in_RDI + 8) + 0x10);
  local_24 = *(int *)(*(long *)(in_RDI + 8) + 0x14) - *(int *)(*(long *)(in_RDI + 8) + 0x10);
  if (local_24 == 0) {
    local_24 = *(int *)(*(long *)(in_RDI + 8) + 0x10);
  }
  iVar2 = sio_setpar(*(undefined8 *)(in_RDI + 0x10),&local_50);
  if ((iVar2 == 0) ||
     (iVar2 = sio_getpar(*(undefined8 *)(in_RDI + 0x10),&local_50), uVar1 = local_38, iVar2 == 0)) {
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Failed to set device parameters\n");
    }
    local_1 = false;
  }
  else if (local_50 == local_4c << 3) {
    if (local_44 == 1) {
      *(undefined4 *)(*(long *)(in_RDI + 8) + 0xc) = local_34;
      __stream = gLogFile;
      if (local_38 < 2) {
        if (*(char *)(*(long *)(in_RDI + 8) + 0x18) != '\0') {
          if (1 < (int)gLogLevel) {
            pAVar3 = DevFmtChannelsString(*(DevFmtChannels *)(*(long *)(in_RDI + 8) + 0x18));
            fprintf((FILE *)__stream,"[ALSOFT] (WW) Got %u channel for %s\n",(ulong)uVar1,pAVar3);
          }
          *(undefined1 *)(*(long *)(in_RDI + 8) + 0x18) = 0;
        }
      }
      else if (((((((local_38 == 2) && (*(char *)(*(long *)(in_RDI + 8) + 0x18) != '\x01')) ||
                  (local_38 == 3)) ||
                 ((local_38 == 4 && (*(char *)(*(long *)(in_RDI + 8) + 0x18) != '\x02')))) ||
                (local_38 == 5)) ||
               ((((local_38 == 6 && (*(char *)(*(long *)(in_RDI + 8) + 0x18) != '\x03')) &&
                 (*(char *)(*(long *)(in_RDI + 8) + 0x18) != '\a')) ||
                ((local_38 == 7 && (*(char *)(*(long *)(in_RDI + 8) + 0x18) != '\x04')))))) ||
              (((local_38 == 8 && (*(char *)(*(long *)(in_RDI + 8) + 0x18) != '\x05')) ||
               (8 < local_38)))) {
        if (1 < (int)gLogLevel) {
          in_stack_ffffffffffffff58 = (FILE *)gLogFile;
          in_stack_ffffffffffffff64 = local_38;
          pAVar3 = DevFmtChannelsString(*(DevFmtChannels *)(*(long *)(in_RDI + 8) + 0x18));
          fprintf(in_stack_ffffffffffffff58,"[ALSOFT] (WW) Got %u channels for %s\n",
                  (ulong)in_stack_ffffffffffffff64,pAVar3);
        }
        *(undefined1 *)(*(long *)(in_RDI + 8) + 0x18) = 1;
      }
      if ((local_50 == 8) && (local_48 == 1)) {
        *(undefined1 *)(*(long *)(in_RDI + 8) + 0x19) = 0;
      }
      else if ((local_50 == 8) && (local_48 == 0)) {
        *(undefined1 *)(*(long *)(in_RDI + 8) + 0x19) = 1;
      }
      else if ((local_50 == 0x10) && (local_48 == 1)) {
        *(undefined1 *)(*(long *)(in_RDI + 8) + 0x19) = 2;
      }
      else if ((local_50 == 0x10) && (local_48 == 0)) {
        *(undefined1 *)(*(long *)(in_RDI + 8) + 0x19) = 3;
      }
      else if ((local_50 == 0x20) && (local_48 == 1)) {
        *(undefined1 *)(*(long *)(in_RDI + 8) + 0x19) = 4;
      }
      else {
        if ((local_50 != 0x20) || (local_48 != 0)) {
          if (0 < (int)gLogLevel) {
            pcVar4 = "unsigned";
            if (local_48 != 0) {
              pcVar4 = "signed";
            }
            fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unhandled sample format: %s %u-bit\n",pcVar4,
                    (ulong)local_50);
          }
          return false;
        }
        *(undefined1 *)(*(long *)(in_RDI + 8) + 0x19) = 5;
      }
      BackendBase::setDefaultChannelOrder((BackendBase *)in_stack_ffffffffffffff50._M_current);
      *(int *)(*(long *)(in_RDI + 8) + 0x10) = local_28;
      *(int *)(*(long *)(in_RDI + 8) + 0x14) = local_30 + local_28;
      std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::resize
                ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (size_type)in_stack_ffffffffffffff58);
      if (local_48 == 1) {
        std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::begin(in_stack_ffffffffffffff38);
        std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::end(in_stack_ffffffffffffff38);
        std::
        fill<__gnu_cxx::__normal_iterator<al::byte*,std::vector<al::byte,al::allocator<al::byte,1ul>>>,al::byte>
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      }
      else if (local_50 == 8) {
        __value = std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::data
                            ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)0x23cd26);
        std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::size
                  ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)(in_RDI + 0x18));
        std::fill_n<al::byte*,unsigned_long,al::byte>
                  ((byte *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (unsigned_long)in_stack_ffffffffffffff58,__value);
      }
      else if (local_50 == 0x10) {
        std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::data
                  ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)0x23cd6a);
        std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::size
                  ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)(in_RDI + 0x18));
        std::fill_n<unsigned_short*,unsigned_long,int>
                  ((unsigned_short *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (unsigned_long)in_stack_ffffffffffffff58,
                   (int *)in_stack_ffffffffffffff50._M_current);
      }
      else if (local_50 == 0x20) {
        std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::data
                  ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)0x23cdb1);
        std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::size
                  ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)(in_RDI + 0x18));
        std::fill_n<unsigned_int*,unsigned_long,unsigned_int>
                  ((uint *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (unsigned_long)in_stack_ffffffffffffff58,
                   (uint *)in_stack_ffffffffffffff50._M_current);
      }
      local_1 = true;
    }
    else {
      if (0 < (int)gLogLevel) {
        pcVar4 = "big";
        if (local_44 != 0) {
          pcVar4 = "little";
        }
        fprintf((FILE *)gLogFile,
                "[ALSOFT] (EE) Non-native-endian samples not supported (got %s-endian)\n",pcVar4);
      }
      local_1 = false;
    }
  }
  else {
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Padded samples not supported (%u of %u bits)\n",
              (ulong)local_50,(ulong)(uint)(local_4c << 3));
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SndioPlayback::reset()
{
    sio_par par;
    sio_initpar(&par);

    par.rate = mDevice->Frequency;
    switch(mDevice->FmtChans)
    {
    case DevFmtMono   : par.pchan = 1; break;
    case DevFmtQuad   : par.pchan = 4; break;
    case DevFmtX51Rear: // fall-through - "Similar to 5.1, except using rear channels instead of sides"
    case DevFmtX51    : par.pchan = 6; break;
    case DevFmtX61    : par.pchan = 7; break;
    case DevFmtX71    : par.pchan = 8; break;

    // fall back to stereo for Ambi3D
    case DevFmtAmbi3D : // fall-through
    case DevFmtStereo : par.pchan = 2; break;
    }

    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        par.bits = 8;
        par.sig = 1;
        break;
    case DevFmtUByte:
        par.bits = 8;
        par.sig = 0;
        break;
    case DevFmtFloat:
    case DevFmtShort:
        par.bits = 16;
        par.sig = 1;
        break;
    case DevFmtUShort:
        par.bits = 16;
        par.sig = 0;
        break;
    case DevFmtInt:
        par.bits = 32;
        par.sig = 1;
        break;
    case DevFmtUInt:
        par.bits = 32;
        par.sig = 0;
        break;
    }
    par.le = SIO_LE_NATIVE;

    par.round = mDevice->UpdateSize;
    par.appbufsz = mDevice->BufferSize - mDevice->UpdateSize;
    if(!par.appbufsz) par.appbufsz = mDevice->UpdateSize;

    if(!sio_setpar(mSndHandle, &par) || !sio_getpar(mSndHandle, &par))
    {
        ERR("Failed to set device parameters\n");
        return false;
    }

    if(par.bits != par.bps*8)
    {
        ERR("Padded samples not supported (%u of %u bits)\n", par.bits, par.bps*8);
        return false;
    }
    if(par.le != SIO_LE_NATIVE)
    {
        ERR("Non-native-endian samples not supported (got %s-endian)\n",
            par.le ? "little" : "big");
        return false;
    }

    mDevice->Frequency = par.rate;

    if(par.pchan < 2)
    {
        if(mDevice->FmtChans != DevFmtMono)
        {
            WARN("Got %u channel for %s\n", par.pchan, DevFmtChannelsString(mDevice->FmtChans));
            mDevice->FmtChans = DevFmtMono;
        }
    }
    else if((par.pchan == 2 && mDevice->FmtChans != DevFmtStereo)
        || par.pchan == 3
        || (par.pchan == 4 && mDevice->FmtChans != DevFmtQuad)
        || par.pchan == 5
        || (par.pchan == 6 && mDevice->FmtChans != DevFmtX51 && mDevice->FmtChans != DevFmtX51Rear)
        || (par.pchan == 7 && mDevice->FmtChans != DevFmtX61)
        || (par.pchan == 8 && mDevice->FmtChans != DevFmtX71)
        || par.pchan > 8)
    {
        WARN("Got %u channels for %s\n", par.pchan, DevFmtChannelsString(mDevice->FmtChans));
        mDevice->FmtChans = DevFmtStereo;
    }

    if(par.bits == 8 && par.sig == 1)
        mDevice->FmtType = DevFmtByte;
    else if(par.bits == 8 && par.sig == 0)
        mDevice->FmtType = DevFmtUByte;
    else if(par.bits == 16 && par.sig == 1)
        mDevice->FmtType = DevFmtShort;
    else if(par.bits == 16 && par.sig == 0)
        mDevice->FmtType = DevFmtUShort;
    else if(par.bits == 32 && par.sig == 1)
        mDevice->FmtType = DevFmtInt;
    else if(par.bits == 32 && par.sig == 0)
        mDevice->FmtType = DevFmtUInt;
    else
    {
        ERR("Unhandled sample format: %s %u-bit\n", (par.sig?"signed":"unsigned"), par.bits);
        return false;
    }

    setDefaultChannelOrder();

    mDevice->UpdateSize = par.round;
    mDevice->BufferSize = par.bufsz + par.round;

    mBuffer.resize(mDevice->UpdateSize * par.pchan*par.bps);
    if(par.sig == 1)
        std::fill(mBuffer.begin(), mBuffer.end(), al::byte{});
    else if(par.bits == 8)
        std::fill_n(mBuffer.data(), mBuffer.size(), al::byte(0x80));
    else if(par.bits == 16)
        std::fill_n(reinterpret_cast<uint16_t*>(mBuffer.data()), mBuffer.size()/2, 0x8000);
    else if(par.bits == 32)
        std::fill_n(reinterpret_cast<uint32_t*>(mBuffer.data()), mBuffer.size()/4, 0x80000000u);

    return true;
}